

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ralocal.cpp
# Opt level: O1

Error __thiscall
asmjit::RALocalAllocator::allocJumpTable
          (RALocalAllocator *this,InstNode *node,RABlocks *targets,RABlock *cont)

{
  uint *puVar1;
  uint32_t uVar2;
  uint32_t uVar3;
  RABlock *block;
  void *pvVar4;
  long lVar5;
  PhysToWorkMap *pPVar6;
  int *piVar7;
  int *piVar8;
  byte bVar9;
  Error EVar10;
  ulong uVar11;
  uint32_t *puVar12;
  undefined8 extraout_RAX;
  BaseRAPass *siglen;
  uint uVar13;
  uint extraout_EDX;
  uchar *sig;
  ulong uVar14;
  uint uVar15;
  RALocalAllocator *this_00;
  int in_R8D;
  long lVar16;
  ulong uVar17;
  
  uVar14 = 3;
  if ((targets->super_ZoneVectorBase)._size == 0) goto LAB_0011e7cd;
  (this->_cc->super_BaseBuilder)._cursor = (node->super_BaseNode).field_0.field_0._prev;
  block = *(targets->super_ZoneVectorBase)._data;
  uVar11 = (ulong)block->_sharedAssignmentId;
  if (uVar11 == 0xffffffff) goto LAB_0011e7cd;
  siglen = this->_pass;
  if (block->_sharedAssignmentId < (siglen->_sharedAssignments).super_ZoneVectorBase._size) {
    pvVar4 = (siglen->_sharedAssignments).super_ZoneVectorBase._data;
    this_00 = this;
    EVar10 = allocInst(this,node);
    uVar14 = (ulong)EVar10;
    if (EVar10 != 0) goto LAB_0011e7cd;
    node = *(InstNode **)((long)pvVar4 + uVar11 * 0x28 + 0x18);
    if (node != (InstNode *)0x0) {
      in_R8D = 1;
      this_00 = this;
      EVar10 = switchToAssignment(this,(PhysToWorkMap *)node,
                                  *(WorkToPhysMap **)((long)pvVar4 + uVar11 * 0x28 + 0x20),
                                  (ZoneBitVector *)((long)pvVar4 + uVar11 * 0x28 + 8),true,false);
      if (EVar10 != 0) {
        uVar14 = (ulong)EVar10;
        goto LAB_0011e7cd;
      }
    }
    uVar13 = block->_sharedAssignmentId;
    if ((ulong)uVar13 == 0xffffffff) {
      puVar12 = &block->_entryScratchGpRegs;
    }
    else {
      siglen = block->_ra;
      if ((siglen->_sharedAssignments).super_ZoneVectorBase._size <= uVar13) goto LAB_0011e886;
      puVar12 = (uint32_t *)
                ((ulong)uVar13 * 0x28 +
                (long)(siglen->_sharedAssignments).super_ZoneVectorBase._data);
    }
    EVar10 = spillScratchGpRegsBeforeEntry(this,*puVar12);
    if (EVar10 == 0) {
      if ((*(long *)((long)pvVar4 + uVar11 * 0x28 + 0x18) == 0) &&
         (EVar10 = BaseRAPass::setBlockEntryAssignment
                             (this->_pass,block,this->_block,&this->_curAssignment), EVar10 != 0)) {
        uVar14 = (ulong)EVar10;
      }
      else {
        uVar14 = 0;
      }
    }
    else {
      uVar14 = (ulong)EVar10;
    }
LAB_0011e7cd:
    return (Error)uVar14;
  }
  allocJumpTable();
  this_00 = this;
LAB_0011e886:
  allocJumpTable();
  uVar13 = (uint)sig;
  if (uVar13 == 0xffffffff) {
    RAAssignment::assign();
LAB_0011e90e:
    RAAssignment::assign();
LAB_0011e913:
    RAAssignment::assign();
LAB_0011e918:
    RAAssignment::assign();
LAB_0011e91d:
    RAAssignment::assign();
LAB_0011e922:
    RAAssignment::assign();
LAB_0011e927:
    RAAssignment::assign();
  }
  else {
    if (*(uint *)((long)&this_00->_cc + 4) <= uVar13) goto LAB_0011e90e;
    lVar16 = *(long *)(this_00->_availableRegs)._masks;
    uVar11 = (ulong)sig & 0xffffffff;
    if (*(char *)(lVar16 + uVar11) != -1) goto LAB_0011e913;
    if (0x1f < (uint)siglen) goto LAB_0011e918;
    uVar17 = (ulong)node & 0xffffffff;
    if (*(int *)(*(long *)((this_00->_clobberedRegs)._masks + uVar17 * 2) +
                ((ulong)siglen & 0xffffffff) * 4) != -1) goto LAB_0011e91d;
    if (3 < (uint)node) goto LAB_0011e922;
    lVar5 = *(long *)((this_00->_availableRegs)._masks + 2);
    uVar15 = 1 << ((byte)siglen & 0x1f);
    node = (InstNode *)(ulong)uVar15;
    if ((*(uint *)(lVar5 + uVar17 * 4) >> ((uint)siglen & 0x1f) & 1) != 0) goto LAB_0011e927;
    if ((*(uint *)(lVar5 + 0x10 + uVar17 * 4) & uVar15) == 0) {
      *(byte *)(lVar16 + uVar11) = (byte)siglen;
      *(uint *)(*(long *)((this_00->_clobberedRegs)._masks + uVar17 * 2) +
               ((ulong)siglen & 0xffffffff) * 4) = uVar13;
      lVar16 = *(long *)((this_00->_availableRegs)._masks + 2);
      puVar1 = (uint *)(lVar16 + uVar17 * 4);
      *puVar1 = *puVar1 | uVar15;
      puVar1 = (uint *)(lVar16 + 0x10 + uVar17 * 4);
      *puVar1 = *puVar1 | -in_R8D & uVar15;
      EVar10 = RAAssignment::verify
                         ((RAAssignment *)this_00,(EVP_PKEY_CTX *)node,sig,(size_t)siglen,
                          (uchar *)(ulong)(-in_R8D & uVar15),uVar11);
      return EVar10;
    }
  }
  uVar13 = (uint)siglen;
  RAAssignment::assign();
  if (extraout_EDX == 0xffffffff) {
    onSaveReg();
LAB_0011e98d:
    onSaveReg();
LAB_0011e992:
    onSaveReg();
LAB_0011e997:
    onSaveReg();
  }
  else {
    if ((this_00->_curAssignment)._layout.workCount <= extraout_EDX) goto LAB_0011e98d;
    if ((this_00->_curAssignment)._workToPhysMap[extraout_EDX].physIds[0] != uVar13)
    goto LAB_0011e992;
    if (0x1f < uVar13) goto LAB_0011e997;
    if ((this_00->_curAssignment)._physToWorkIds[(ulong)node & 0xffffffff][uVar13] == extraout_EDX)
    {
      if ((uint)node < 4) {
        bVar9 = (byte)uVar13 & 0x1f;
        pPVar6 = (this_00->_curAssignment)._physToWorkMap;
        puVar12 = (pPVar6->dirty)._masks + ((ulong)node & 0xffffffff);
        *puVar12 = *puVar12 & (-2 << bVar9 | 0xfffffffeU >> 0x20 - bVar9);
        EVar10 = (*(this_00->_pass->super_FuncPass).super_Pass._vptr_Pass[0xc])
                           (this_00->_pass,(ulong)extraout_EDX,(ulong)uVar13,extraout_RAX,pPVar6,
                            (ulong)uVar13,uVar14);
        return EVar10;
      }
      goto LAB_0011e9a1;
    }
  }
  onSaveReg();
LAB_0011e9a1:
  onSaveReg();
  if ((((*(uint32_t *)&this_00->_pass == *(uint32_t *)&(node->super_BaseNode).field_0) &&
       (*(uint32_t *)((long)&this_00->_pass + 4) ==
        *(uint32_t *)((long)&(node->super_BaseNode).field_0 + 4))) &&
      (uVar2 = *(uint32_t *)&this_00->_cc,
      uVar2 == *(uint32_t *)((long)&(node->super_BaseNode).field_0 + 8))) &&
     ((uVar3 = *(uint32_t *)((long)&this_00->_cc + 4),
      uVar3 == *(uint32_t *)((long)&(node->super_BaseNode).field_0 + 0xc) &&
      (this_00->_archTraits == *(ArchTraits **)&(node->super_BaseNode).field_1)))) {
    if (uVar2 != 0) {
      lVar16 = 0;
      do {
        if (*(int *)(*(long *)((this_00->_availableRegs)._masks + 2) + 0x20 + lVar16 * 4) !=
            *(int *)((long)(node->super_BaseNode)._passData + lVar16 * 4 + 0x20)) {
          return 0;
        }
        lVar16 = lVar16 + 1;
      } while (uVar2 != (uint32_t)lVar16);
    }
    if (uVar3 != 0) {
      lVar16 = 0;
      do {
        if (*(char *)(*(long *)(this_00->_availableRegs)._masks + lVar16) !=
            *(char *)((long)(node->super_BaseNode).field_3._userDataPtr + lVar16)) {
          return 0;
        }
        lVar16 = lVar16 + 1;
      } while (uVar3 != (uint32_t)lVar16);
    }
    piVar7 = *(int **)((this_00->_availableRegs)._masks + 2);
    piVar8 = (int *)(node->super_BaseNode)._passData;
    if ((((*piVar7 == *piVar8) && (piVar7[1] == piVar8[1])) &&
        ((piVar7[2] == piVar8[2] &&
         (((piVar7[3] == piVar8[3] && (piVar7[4] == piVar8[4])) && (piVar7[5] == piVar8[5])))))) &&
       (piVar7[6] == piVar8[6])) {
      return CONCAT31((int3)((uint)piVar7[7] >> 8),piVar7[7] == piVar8[7]);
    }
  }
  return 0;
}

Assistant:

Error RALocalAllocator::allocJumpTable(InstNode* node, const RABlocks& targets, RABlock* cont) noexcept {
  // TODO: Do we really need to use `cont`?
  DebugUtils::unused(cont);

  if (targets.empty())
    return DebugUtils::errored(kErrorInvalidState);

  // The cursor must point to the previous instruction for a possible instruction insertion.
  _cc->_setCursor(node->prev());

  // All `targets` should have the same sharedAssignmentId, we just read the first.
  RABlock* anyTarget = targets[0];
  if (!anyTarget->hasSharedAssignmentId())
    return DebugUtils::errored(kErrorInvalidState);

  RASharedAssignment& sharedAssignment = _pass->_sharedAssignments[anyTarget->sharedAssignmentId()];

  ASMJIT_PROPAGATE(allocInst(node));

  if (!sharedAssignment.empty()) {
    ASMJIT_PROPAGATE(switchToAssignment(
      sharedAssignment.physToWorkMap(),
      sharedAssignment.workToPhysMap(),
      sharedAssignment.liveIn(),
      true,  // Read-only.
      false  // Try-mode.
    ));
  }

  ASMJIT_PROPAGATE(spillRegsBeforeEntry(anyTarget));

  if (sharedAssignment.empty()) {
    ASMJIT_PROPAGATE(_pass->setBlockEntryAssignment(anyTarget, block(), _curAssignment));
  }

  return kErrorOk;
}